

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O0

void read_gif_map(j_decompress_ptr cinfo,FILE *infile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *in_RSI;
  long *in_RDI;
  int B;
  int G;
  int R;
  int colormaplen;
  int i;
  int header [13];
  int iVar4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  byte local_20;
  
  for (iVar4 = 1; iVar4 < 0xd; iVar4 = iVar4 + 1) {
    iVar1 = getc(in_RSI);
    *(int *)(&stack0xffffffffffffffb8 + (long)iVar4 * 4) = iVar1;
    if (iVar1 == -1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x412;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  if ((in_stack_ffffffffffffffbc != 0x49) || (in_stack_ffffffffffffffc0 != 0x46)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x412;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((local_20 & 0x80) == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x412;
    (**(code **)*in_RDI)(in_RDI);
  }
  for (iVar4 = 0; iVar4 < 2 << (local_20 & 7); iVar4 = iVar4 + 1) {
    iVar1 = getc(in_RSI);
    iVar2 = getc(in_RSI);
    iVar3 = getc(in_RSI);
    if (((iVar1 == -1) || (iVar2 == -1)) || (iVar3 == -1)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x412;
      (**(code **)*in_RDI)(in_RDI);
    }
    add_map_entry((j_decompress_ptr)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,iVar4);
  }
  return;
}

Assistant:

LOCAL(void)
read_gif_map(j_decompress_ptr cinfo, FILE *infile)
{
  int header[13];
  int i, colormaplen;
  int R, G, B;

  /* Initial 'G' has already been read by read_color_map */
  /* Read the rest of the GIF header and logical screen descriptor */
  for (i = 1; i < 13; i++) {
    if ((header[i] = getc(infile)) == EOF)
      ERREXIT(cinfo, JERR_BAD_CMAP_FILE);
  }

  /* Verify GIF Header */
  if (header[1] != 'I' || header[2] != 'F')
    ERREXIT(cinfo, JERR_BAD_CMAP_FILE);

  /* There must be a global color map. */
  if ((header[10] & 0x80) == 0)
    ERREXIT(cinfo, JERR_BAD_CMAP_FILE);

  /* OK, fetch it. */
  colormaplen = 2 << (header[10] & 0x07);

  for (i = 0; i < colormaplen; i++) {
    R = getc(infile);
    G = getc(infile);
    B = getc(infile);
    if (R == EOF || G == EOF || B == EOF)
      ERREXIT(cinfo, JERR_BAD_CMAP_FILE);
    add_map_entry(cinfo,
                  R << (BITS_IN_JSAMPLE - 8),
                  G << (BITS_IN_JSAMPLE - 8),
                  B << (BITS_IN_JSAMPLE - 8));
  }
}